

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

string * __thiscall
vkt::tessellation::(anonymous_namespace)::Variable::basicSubobjectAtIndex_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int subobjectIndex,int arraySize)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  int iVar5;
  BasicTypeIterator basicIt;
  VarType type;
  SubTypeIterator<glu::IsBasicType> local_210;
  VarType local_1f0;
  TypeAccessFormat local_1d8;
  long *local_1c8 [2];
  long local_1b8 [2];
  SubTypeIterator<glu::IsBasicType> local_1a8 [3];
  ios_base local_138 [264];
  
  if (*(char *)((long)this + 0x40) == '\x01') {
    glu::VarType::VarType(&local_1f0,(VarType *)((long)this + 0x28),arraySize);
  }
  else {
    glu::VarType::VarType(&local_1f0,(VarType *)((long)this + 0x28));
  }
  glu::SubTypeIterator<glu::IsBasicType>::SubTypeIterator(&local_210,&local_1f0);
  iVar5 = subobjectIndex + 1;
  while( true ) {
    local_1a8[0].m_path.
    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].m_path.
    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8[0].m_type = (VarType *)0x0;
    local_1a8[0].m_path.
    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bVar2 = glu::SubTypeIterator<glu::IsBasicType>::operator!=(&local_210,local_1a8);
    if (local_1a8[0].m_path.
        super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8[0].m_path.
                      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8[0].m_path.
                            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8[0].m_path.
                            super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar2) break;
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      local_1d8.path = &local_210.m_path;
      local_1d8.type = &local_1f0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      glu::operator<<((ostream *)local_1a8,&local_1d8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_1c8,0,(char *)0x0,*(ulong *)((long)this + 8));
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      if (local_210.m_path.
          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.m_path.
                        super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_210.m_path.
                              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.m_path.
                              super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar2) {
        glu::VarType::~VarType(&local_1f0);
        return __return_storage_ptr__;
      }
LAB_007a4e10:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    glu::SubTypeIterator<glu::IsBasicType>::operator++(&local_210);
  }
  if (local_210.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.m_path.
                    super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_210.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.m_path.
                          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  goto LAB_007a4e10;
}

Assistant:

std::string Variable::basicSubobjectAtIndex (const int subobjectIndex, const int arraySize) const
{
	const glu::VarType	type		 = m_isArray ? glu::VarType(m_type, arraySize) : m_type;
	int					currentIndex = 0;

	for (glu::BasicTypeIterator basicIt = glu::BasicTypeIterator::begin(&type); basicIt != glu::BasicTypeIterator::end(&type); ++basicIt)
	{
		if (currentIndex == subobjectIndex)
			return m_name + de::toString(glu::TypeAccessFormat(type, basicIt.getPath()));
		++currentIndex;
	}
	DE_ASSERT(false);
	return DE_NULL;
}